

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

bool __thiscall flatbuffers::Parser::Parse(Parser *this,char *source)

{
  StructDef *pSVar1;
  EnumDef *pEVar2;
  bool bVar3;
  Offset<flatbuffers::Table> root;
  pointer ppSVar4;
  pointer ppEVar5;
  pointer ppEVar6;
  string root_type;
  string local_98;
  FlatBufferBuilder *local_78;
  allocator local_70 [64];
  
  this->cursor_ = source;
  this->source_ = source;
  this->line_ = 1;
  (this->error_)._M_string_length = 0;
  *(this->error_)._M_dataplus._M_p = '\0';
  local_78 = &this->builder_;
  FlatBufferBuilder::Clear(local_78);
  Next(this);
LAB_00111c83:
  switch(this->token_) {
  case 0:
    goto switchD_00111c96_caseD_0;
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
switchD_00111c96_caseD_1:
    ParseDecl(this);
    goto LAB_00111c83;
  case 7:
    bVar3 = false;
    break;
  case 8:
    bVar3 = true;
    break;
  case 9:
    Next(this);
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->name_space_,&this->attribute_);
      Expect(this,4);
      bVar3 = IsNext(this,0x2e);
    } while (bVar3);
    Expect(this,0x3b);
    goto LAB_00111c83;
  case 10:
    Next(this);
    std::__cxx11::string::string((string *)&root_type,(string *)&this->attribute_);
    Expect(this,4);
    Expect(this,0x3b);
    bVar3 = SetRootType(this,root_type._M_dataplus._M_p);
    if (!bVar3) goto LAB_00111e7b;
    if (this->root_struct_def->fixed == true) goto LAB_00111e5b;
    std::__cxx11::string::~string((string *)&root_type);
    goto LAB_00111c83;
  default:
    if (this->token_ != 0x7b) goto switchD_00111c96_caseD_1;
    if (this->root_struct_def != (StructDef *)0x0) {
      if (((int)(this->builder_).buf_.reserved_ - *(int *)&(this->builder_).buf_.cur_) +
          *(int *)&(this->builder_).buf_.buf_ == 0) goto LAB_00111ccc;
      goto LAB_00111eb5;
    }
    goto LAB_00111e99;
  }
  ParseEnum(this,bVar3);
  goto LAB_00111c83;
LAB_00111ccc:
  root.o = ParseTable(this,this->root_struct_def);
  FlatBufferBuilder::Finish<flatbuffers::Table>(local_78,root);
  goto LAB_00111c83;
LAB_00111e5b:
  std::__cxx11::string::string((string *)&local_98,"root type must be a table",local_70);
  Error(&local_98);
LAB_00111e7b:
  std::operator+(&local_98,"unknown root type: ",&root_type);
  Error(&local_98);
LAB_00111e99:
  std::__cxx11::string::string
            ((string *)&root_type,"no root type set to parse json with",(allocator *)&local_98);
  Error(&root_type);
LAB_00111eb5:
  std::__cxx11::string::string
            ((string *)&root_type,"cannot have more than one json object in a file",
             (allocator *)&local_98);
  Error(&root_type);
  goto LAB_00111ed1;
switchD_00111c96_caseD_0:
  ppSVar4 = (this->structs_).vec.
            super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppSVar4 ==
        (this->structs_).vec.
        super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) goto LAB_00111dcb;
    pSVar1 = *ppSVar4;
    ppSVar4 = ppSVar4 + 1;
  } while (pSVar1->predecl != true);
  std::operator+(&root_type,"type referenced but not defined: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pSVar1);
  Error(&root_type);
LAB_00111dcb:
  for (ppEVar5 = (this->enums_).vec.
                 super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppEVar5 !=
      (this->enums_).vec.
      super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppEVar5 = ppEVar5 + 1) {
    pEVar2 = *ppEVar5;
    if (pEVar2->is_union == true) {
      for (ppEVar6 = (pEVar2->vals).vec.
                     super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppEVar6 !=
          (pEVar2->vals).vec.
          super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppEVar6 = ppEVar6 + 1) {
        pSVar1 = (*ppEVar6)->struct_def;
        if ((pSVar1 != (StructDef *)0x0) && (pSVar1->fixed == true)) {
          std::operator+(&root_type,"only tables can be union elements: ",&(*ppEVar6)->name);
          Error(&root_type);
          goto LAB_00111e5b;
        }
      }
    }
  }
  if ((this->struct_stack_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      (this->struct_stack_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    return true;
  }
LAB_00111ed1:
  __assert_fail("!struct_stack_.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/src/idl_parser.cpp"
                ,0x2d0,"bool flatbuffers::Parser::Parse(const char *)");
}

Assistant:

bool Parser::Parse(const char *source) {
  source_ = cursor_ = source;
  line_ = 1;
  error_.clear();
  builder_.Clear();
  try {
    Next();
    while (token_ != kTokenEof) {
      if (token_ == kTokenNameSpace) {
        Next();
        for (;;) {
          name_space_.push_back(attribute_);
          Expect(kTokenIdentifier);
          if (!IsNext('.')) break;
        }
        Expect(';');
      } else if (token_ == '{') {
        if (!root_struct_def) Error("no root type set to parse json with");
        if (builder_.GetSize()) {
          Error("cannot have more than one json object in a file");
        }
        builder_.Finish(Offset<Table>(ParseTable(*root_struct_def)));
      } else if (token_ == kTokenEnum) {
        ParseEnum(false);
      } else if (token_ == kTokenUnion) {
        ParseEnum(true);
      } else if (token_ == kTokenRootType) {
        Next();
        auto root_type = attribute_;
        Expect(kTokenIdentifier);
        Expect(';');
        if (!SetRootType(root_type.c_str()))
          Error("unknown root type: " + root_type);
        if (root_struct_def->fixed)
          Error("root type must be a table");
      } else {
        ParseDecl();
      }
    }
    for (auto it = structs_.vec.begin(); it != structs_.vec.end(); ++it) {
      if ((*it)->predecl)
        Error("type referenced but not defined: " + (*it)->name);
    }
    for (auto it = enums_.vec.begin(); it != enums_.vec.end(); ++it) {
      auto &enum_def = **it;
      if (enum_def.is_union) {
        for (auto it = enum_def.vals.vec.begin();
             it != enum_def.vals.vec.end();
             ++it) {
          auto &val = **it;
          if (val.struct_def && val.struct_def->fixed)
            Error("only tables can be union elements: " + val.name);
        }
      }
    }
  } catch (const std::string &msg) {
    error_ = "line " + NumToString(line_) + ": " + msg;
    return false;
  }
  assert(!struct_stack_.size());
  return true;
}